

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  runtime_error *this;
  long *plVar4;
  long *plVar5;
  bool bVar6;
  long lVar7;
  string sourceLC;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (_source->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + _source->_M_string_length);
  puVar2 = local_90;
  if (local_88 != 0) {
    lVar7 = 0;
    do {
      iVar3 = tolower((int)(char)puVar2[lVar7]);
      puVar2[lVar7] = (char)iVar3;
      lVar7 = lVar7 + 1;
    } while (local_88 != lVar7);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  bVar6 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar3 != 0) {
                iVar3 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar3 != 0) {
                    iVar3 = std::__cxx11::string::compare((char *)&local_90);
                    if (iVar3 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,
                                     "Expected a boolean value but did not recognise:\n  \'",_source
                                    );
                      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
                      local_70 = (long *)*plVar4;
                      plVar5 = plVar4 + 2;
                      if (local_70 == plVar5) {
                        local_60 = *plVar5;
                        lStack_58 = plVar4[3];
                        local_70 = &local_60;
                      }
                      else {
                        local_60 = *plVar5;
                      }
                      local_68 = plVar4[1];
                      *plVar4 = (long)plVar5;
                      plVar4[1] = 0;
                      *(undefined1 *)(plVar4 + 2) = 0;
                      std::runtime_error::runtime_error(this,(string *)&local_70);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            bVar6 = false;
          }
        }
      }
    }
  }
  *_dest = bVar6;
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }